

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48 [16];
  string local_38;
  
  if ((this->m_info).capturedExpression._M_string_length == 0) {
    bVar3 = false;
  }
  else {
    pcVar1 = (this->m_resultData).reconstructedExpression._M_dataplus._M_p;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,
               pcVar1 + (this->m_resultData).reconstructedExpression._M_string_length);
    getExpression_abi_cxx11_(&local_38,this);
    if (local_50 == local_38._M_string_length) {
      if (local_50 == 0) {
        bVar3 = false;
      }
      else {
        iVar2 = bcmp(local_58,local_38._M_dataplus._M_p,local_50);
        bVar3 = iVar2 != 0;
      }
    }
    else {
      bVar3 = true;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_58 != local_48) {
      operator_delete(local_58);
    }
  }
  return bVar3;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs ) {
            return opCast( lhs ) >= opCast( rhs );
        }